

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_binding.cpp
# Opt level: O3

ErrorData * __thiscall
duckdb::TableBinding::ColumnNotFoundError
          (ErrorData *__return_storage_ptr__,TableBinding *this,string *column_name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  string *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  string candidate_message;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  paVar1 = &local_f0.field_2;
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"Candidate bindings: ","");
  StringUtil::CandidatesErrorMessage
            (&local_50,&(this->super_Binding).names,(string *)column_name,&local_f0,5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  local_70[0] = local_60;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,"Table \"%s\" does not have a column named \"%s\"\n%s","");
  psVar3 = BindingAlias::GetAlias_abi_cxx11_(&(this->super_Binding).alias);
  pcVar2 = (psVar3->_M_dataplus)._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar2,pcVar2 + psVar3->_M_string_length);
  pcVar2 = (column_name->_M_dataplus)._M_p;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar2,pcVar2 + column_name->_M_string_length);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,local_50._M_dataplus._M_p,
             local_50._M_dataplus._M_p + local_50._M_string_length);
  StringUtil::Format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            ((string *)&local_f0,(StringUtil *)local_70,&local_90,&local_b0,&local_d0,in_R9);
  ErrorData::ErrorData(__return_storage_ptr__,BINDER,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

ErrorData TableBinding::ColumnNotFoundError(const string &column_name) const {
	auto candidate_message = StringUtil::CandidatesErrorMessage(names, column_name, "Candidate bindings: ");
	return ErrorData(ExceptionType::BINDER, StringUtil::Format("Table \"%s\" does not have a column named \"%s\"\n%s",
	                                                           alias.GetAlias(), column_name, candidate_message));
}